

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O1

EmitInfo __thiscall Wasm::WasmBytecodeGenerator::EmitV8X16Shuffle(WasmBytecodeGenerator *this)

{
  RegSlot RVar1;
  RegisterSpace *this_00;
  WasmCompilationException *this_01;
  WasmBinaryReader *pWVar2;
  ulong uVar3;
  EmitInfo local_30;
  EmitInfo arg2Info;
  EmitInfo arg1Info;
  
  local_30 = PopEvalStack(this,V128,(char16 *)0x0);
  arg2Info = PopEvalStack(this,V128,(char16 *)0x0);
  ReleaseLocation(this,&local_30);
  ReleaseLocation(this,&arg2Info);
  Simd::EnsureSimdIsEnabled();
  this_00 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(&this->mTypedRegisterAllocator,SIMD);
  RVar1 = WAsmJs::RegisterSpace::AcquireTmpRegister(this_00);
  pWVar2 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  if (pWVar2 == (WasmBinaryReader *)0x0) {
    pWVar2 = (this->m_module->m_reader).ptr;
  }
  uVar3 = 0;
  do {
    if (0x1f < *(byte *)((long)&(pWVar2->super_WasmReaderBase).m_currentNode.field_1 + uVar3)) {
      this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException
                (this_01,L"%u-th shuffle lane index is larger than %u",uVar3 & 0xffffffff,0x1f);
      __cxa_throw(this_01,&WasmCompilationException::typeinfo,
                  WasmCompilationException::~WasmCompilationException);
    }
    uVar3 = uVar3 + 1;
  } while (uVar3 != 0x10);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x15])
            (this->m_writer,0x230,(ulong)RVar1,(ulong)arg2Info & 0xffffffff,
             (ulong)local_30 & 0xffffffff);
  return (EmitInfo)((ulong)RVar1 | 0x500000000);
}

Assistant:

EmitInfo WasmBytecodeGenerator::EmitV8X16Shuffle()
{
    EmitInfo arg2Info = PopEvalStack(WasmTypes::V128);
    EmitInfo arg1Info = PopEvalStack(WasmTypes::V128);

    ReleaseLocation(&arg2Info);
    ReleaseLocation(&arg1Info);

    Js::RegSlot resultReg = GetRegisterSpace(WasmTypes::V128)->AcquireTmpRegister();
    EmitInfo resultInfo(resultReg, WasmTypes::V128);

    uint8* indices = GetReader()->m_currentNode.shuffle.indices;
    for (uint i = 0; i < Simd::MAX_LANES; i++)
    {
        if (indices[i] >= Simd::MAX_LANES * 2)
        {
            throw WasmCompilationException(_u("%u-th shuffle lane index is larger than %u"), i, (Simd::MAX_LANES * 2 -1));
        }
    }

    m_writer->AsmShuffle(Js::OpCodeAsmJs::Simd128_Shuffle_V8X16, resultReg, arg1Info.location, arg2Info.location, indices);
    return resultInfo;
}